

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall xray_re::cse_smart_cover::cse_smart_cover(cse_smart_cover *this)

{
  shape_def_vec *psVar1;
  
  (this->super_cse_shape)._vptr_cse_shape = (_func_int **)&PTR__cse_shape_00246958;
  psVar1 = &(this->super_cse_shape).m_shapes;
  (psVar1->super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (psVar1->super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_cse_shape).m_shapes.
  super__Vector_base<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cse_abstract::cse_abstract((cse_abstract *)&this->super_cse_alife_dynamic_object);
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.m_graph_id = 0xffff;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.m_distance = 0.0;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.m_direct_control = false;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.m_node_id = 0xffffffff;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.m_flags = 0xffffffff;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.m_story_id = 0xffffffff;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.m_spawn_story_id = 0xffffffff;
  (this->super_cse_shape)._vptr_cse_shape = (_func_int **)&PTR__cse_smart_cover_00246bb8;
  (this->super_cse_alife_dynamic_object).super_cse_alife_object.super_cse_abstract.
  _vptr_cse_abstract = (_func_int **)&PTR__cse_smart_cover_00246c00;
  (this->m_cs_unk1_sz)._M_dataplus._M_p = (pointer)&(this->m_cs_unk1_sz).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_cs_unk1_sz,"");
  this->m_cs_unk2_float = 0.0;
  this->m_enter_min_enemy_distance = 15.0;
  this->m_exit_min_enemy_distance = 10.0;
  this->m_is_combat_cover = true;
  this->m_cs_unk3_u8 = '\0';
  return;
}

Assistant:

cse_smart_cover::cse_smart_cover():
	m_cs_unk1_sz(""), m_cs_unk2_float(0.f),
	m_enter_min_enemy_distance(15.f), m_exit_min_enemy_distance(10.f),
	m_is_combat_cover(true), m_cs_unk3_u8(0) {}